

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Enum
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((0 < *(int *)(enm + 4)) && (*(int *)(*(long *)(enm + 0x28) + 4) != 0)) {
    lVar1 = *(long *)(enm + 8);
    if ((proto->value_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      other = internal::LogMessage::operator<<
                        (&local_60,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    AddError(this,(string *)(lVar1 + 0x20),
             (Message *)((proto->value_).super_RepeatedPtrFieldBase.rep_)->elements[0],NUMBER,
             "The first enum value must be zero in proto3.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Enum(EnumDescriptor* enm,
                                           const EnumDescriptorProto& proto) {
  if (enm->value_count() > 0 && enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero in proto3.");
  }
}